

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.cpp
# Opt level: O0

void boost::filesystem::detail::copy_symlink
               (path *existing_symlink,path *new_symlink,error_code *ec)

{
  unspecified_bool_type p_Var1;
  undefined1 local_40 [8];
  path p;
  error_code *ec_local;
  path *new_symlink_local;
  path *existing_symlink_local;
  
  p.m_pathname.field_2._8_8_ = ec;
  read_symlink((path *)local_40,existing_symlink,ec);
  if ((p.m_pathname.field_2._8_8_ == 0) ||
     (p_Var1 = system::error_code::operator_cast_to_function_pointer
                         ((error_code *)p.m_pathname.field_2._8_8_),
     p_Var1 == (unspecified_bool_type)0x0)) {
    create_symlink((path *)local_40,new_symlink,(error_code *)p.m_pathname.field_2._8_8_);
  }
  filesystem::path::~path((path *)local_40);
  return;
}

Assistant:

BOOST_FILESYSTEM_DECL
  void copy_symlink(const path& existing_symlink, const path& new_symlink,
    system::error_code* ec)
  {
# if defined(_WIN32_WINNT) && _WIN32_WINNT < 0x0600
    error(BOOST_ERROR_NOT_SUPPORTED, new_symlink, existing_symlink, ec,
      "boost::filesystem::copy_symlink");

# else  // modern Windows or BOOST_POSIX_API 
    path p(read_symlink(existing_symlink, ec));
    if (ec != 0 && *ec) return;
    create_symlink(p, new_symlink, ec);

# endif
  }